

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::
     ParseTimeSampledEnumProperty<tinyusdz::UsdUVTexture::Wrap,tinyusdz::UsdUVTexture::Wrap>
               (string *prop_name,bool strict_allowedToken_check,
               EnumHandlerFun<tinyusdz::UsdUVTexture::Wrap> *enum_handler,Attribute *attr,
               TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_>
               *result,string *warn,string *err)

{
  PrimVar *this;
  double t;
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  value_type *pvVar5;
  long lVar6;
  value_type_conflict3 *pvVar7;
  value_type_conflict *pvVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_> *args_1;
  Attribute *args;
  undefined7 in_register_00000031;
  char *pcVar9;
  string *args_2;
  int iVar10;
  allocator local_2a9;
  string *local_2a8;
  undefined1 local_2a0 [16];
  optional<double> pv;
  undefined1 local_250 [32];
  optional<tinyusdz::Token> tok;
  expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  e;
  expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  e_1;
  ostringstream ss_e;
  undefined1 uStack_1a7;
  storage_t<tinyusdz::Token> local_1a0 [11];
  
  if (result == (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_> *)
                0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar3 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"ParseTimeSampledEnumProperty");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x69b);
    ::std::operator<<(poVar3," ");
    poVar3 = ::std::operator<<((ostream *)&ss_e,"[Internal error] `result` arg is nullptr.");
    ::std::operator<<(poVar3,"\n");
    goto LAB_001f9282;
  }
  local_2a0._12_4_ = (undefined4)CONCAT71(in_register_00000031,strict_allowedToken_check);
  args = attr;
  args_1 = result;
  args_2 = warn;
  bVar1 = Attribute::is_connection(attr);
  if (bVar1) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar3 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"ParseTimeSampledEnumProperty");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x69f);
    ::std::operator<<(poVar3," ");
    pcVar9 = 
    "Attribute connection is not supported in TinyUSDZ for built-in \'enum\' token attribute: {}";
LAB_001f9190:
    ::std::__cxx11::string::string((string *)&e,pcVar9,(allocator *)&e_1);
    fmt::format<std::__cxx11::string>
              ((string *)&tok,(fmt *)&e,(string *)prop_name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    poVar3 = ::std::operator<<((ostream *)&ss_e,(string *)&tok);
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
LAB_001f9282:
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tok,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err);
      ::std::__cxx11::string::operator=((string *)err,(string *)&tok);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    return false;
  }
  if (attr->_variability != Uniform) {
    tok.has_value_ = false;
    tok._1_3_ = 0;
    tok._4_2_ = 0;
    tok.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    tok.contained._8_1_ = 0;
    tok.contained._9_7_ = 0;
    tok.contained._16_1_ = 0;
    tok.contained._17_8_ = 0;
    local_2a8 = prop_name;
    bVar1 = Attribute::is_blocked(attr);
    if (bVar1) {
      result->_blocked = true;
    }
    this = &attr->_var;
    bVar2 = primvar::PrimVar::has_value(this);
    if (bVar2) {
      Attribute::get_value<tinyusdz::Token>((optional<tinyusdz::Token> *)&ss_e,attr);
      nonstd::optional_lite::optional<tinyusdz::Token>::optional<tinyusdz::Token,_0>
                ((optional<tinyusdz::Token> *)&e,(optional<tinyusdz::Token> *)&ss_e);
      nonstd::optional_lite::optional<tinyusdz::Token>::~optional
                ((optional<tinyusdz::Token> *)&ss_e);
      if (e.contained.
          super_storage_t_impl<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0.m_value._0_1_ == '\x01') {
        pbVar4 = &nonstd::optional_lite::optional<tinyusdz::Token>::value
                            ((optional<tinyusdz::Token> *)&e)->str_;
        ::std::
        function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()(&e_1,enum_handler,pbVar4);
        if (e_1.contained.
            super_storage_t_impl<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .m_has_value == true) {
          pvVar5 = nonstd::expected_lite::
                   expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::value(&e_1);
          tok._0_4_ = *pvVar5;
          tok._4_2_ = 1;
          bVar2 = true;
          bVar1 = true;
        }
        else if (local_2a0[0xc] == '\0') {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar3 = ::std::operator<<((ostream *)&ss_e,"[warn]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ParseTimeSampledEnumProperty");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x6da);
          ::std::operator<<(poVar3," ");
          ::std::__cxx11::string::string
                    ((string *)local_250,"Attribute `{}`: `{}` is not an allowed token. Ignore it.",
                     (allocator *)local_2a0);
          pbVar4 = &nonstd::optional_lite::optional<tinyusdz::Token>::value
                              ((optional<tinyusdz::Token> *)&e)->str_;
          fmt::format<std::__cxx11::string,std::__cxx11::string>
                    ((string *)&pv,(fmt *)local_250,local_2a8,pbVar4,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
          poVar3 = ::std::operator<<((ostream *)&ss_e,(string *)&pv);
          ::std::operator<<(poVar3,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (warn != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &pv,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_250,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             err);
            ::std::__cxx11::string::operator=((string *)warn,(string *)&pv);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar2 = true;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar3 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ParseTimeSampledEnumProperty");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x6d8);
          ::std::operator<<(poVar3," ");
          ::std::__cxx11::string::string
                    ((string *)local_250,"Attribute `{}`: `{}` is not an allowed token.",
                     (allocator *)local_2a0);
          pbVar4 = &nonstd::optional_lite::optional<tinyusdz::Token>::value
                              ((optional<tinyusdz::Token> *)&e)->str_;
          fmt::format<std::__cxx11::string,std::__cxx11::string>
                    ((string *)&pv,(fmt *)local_250,local_2a8,pbVar4,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
          poVar3 = ::std::operator<<((ostream *)&ss_e,(string *)&pv);
          ::std::operator<<(poVar3,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &pv,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_250,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&pv);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar2 = false;
        }
        nonstd::expected_lite::
        expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~expected(&e_1);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar3 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar3 = ::std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar3 = ::std::operator<<(poVar3,":");
        poVar3 = ::std::operator<<(poVar3,"ParseTimeSampledEnumProperty");
        poVar3 = ::std::operator<<(poVar3,"():");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x6df);
        ::std::operator<<(poVar3," ");
        ::std::__cxx11::string::string
                  ((string *)&pv,
                   "Internal error. Maybe type mismatch? Attribute `{}` must be type `token`, but got type `{}`"
                   ,(allocator *)local_2a0);
        Attribute::type_name_abi_cxx11_((string *)local_250,attr);
        fmt::format<std::__cxx11::string,std::__cxx11::string>
                  ((string *)&e_1,(fmt *)&pv,local_2a8,(string *)local_250,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
        poVar3 = ::std::operator<<((ostream *)&ss_e,(string *)&e_1);
        ::std::operator<<(poVar3,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e_1
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pv
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err
                          );
          ::std::__cxx11::string::operator=((string *)err,(string *)&e_1);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        bVar2 = false;
      }
      nonstd::optional_lite::optional<tinyusdz::Token>::~optional((optional<tinyusdz::Token> *)&e);
      if (!bVar2) {
LAB_001fa3b0:
        bVar2 = false;
        goto LAB_001fa3b2;
      }
    }
    lVar6 = (long)(attr->_var)._ts._samples.
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(attr->_var)._ts._samples.
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if (lVar6 == 0) {
      bVar2 = true;
      if (bVar1 == false) goto LAB_001fa3b2;
    }
    else {
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x28;
      for (local_2a0._0_8_ = (pointer)0x0; (ulong)local_2a0._0_8_ < (pointer)(lVar6 / 0x28);
          local_2a0._0_8_ = local_2a0._0_8_ + 1) {
        primvar::PrimVar::get_ts_time((optional<double> *)&ss_e,this,local_2a0._0_8_);
        pv.has_value_ = (bool)ss_e;
        if (ss_e == (ostringstream)0x0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar3 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ParseTimeSampledEnumProperty");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x6ef);
          ::std::operator<<(poVar3," ");
          ::std::__cxx11::string::string
                    ((string *)&e_1,"Internal error. Failed to get timecode for `{}`",
                     (allocator *)local_250);
          fmt::format<std::__cxx11::string>
                    ((string *)&e,(fmt *)&e_1,(string *)local_2a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar4);
          poVar3 = ::std::operator<<((ostream *)&ss_e,(string *)&e);
          ::std::operator<<(poVar3,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e
                             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &e_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&e);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          goto LAB_001fa3b0;
        }
        pv.contained = (storage_t<double>)local_1a0[0]._0_8_;
        pvVar7 = nonstd::optional_lite::optional<double>::value(&pv);
        t = *pvVar7;
        primvar::PrimVar::is_ts_value_blocked((PrimVar *)&ss_e,(size_t)this);
        pv.has_value_ = (bool)ss_e;
        if (ss_e == (ostringstream)0x1) {
          pv._1_1_ = uStack_1a7;
          pvVar8 = nonstd::optional_lite::optional<bool>::value((optional<bool> *)&pv);
          if (*pvVar8 == true) {
            TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::add_blocked_sample
                      ((TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap> *)&tok.contained,t);
            iVar10 = 0x16;
          }
          else {
            primvar::PrimVar::get_ts_value<tinyusdz::Token>
                      ((optional<tinyusdz::Token> *)&ss_e,this,local_2a0._0_8_);
            nonstd::optional_lite::optional<tinyusdz::Token>::optional<tinyusdz::Token,_0>
                      ((optional<tinyusdz::Token> *)&e,(optional<tinyusdz::Token> *)&ss_e);
            nonstd::optional_lite::optional<tinyusdz::Token>::~optional
                      ((optional<tinyusdz::Token> *)&ss_e);
            if (e.contained.
                super_storage_t_impl<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .field_0.m_value._0_1_ == '\x01') {
              __args = &nonstd::optional_lite::optional<tinyusdz::Token>::value
                                  ((optional<tinyusdz::Token> *)&e)->str_;
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::operator()(&e_1,enum_handler,__args);
              if (e_1.contained.
                  super_storage_t_impl<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .m_has_value == true) {
                pvVar5 = nonstd::expected_lite::
                         expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::value(&e_1);
                TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::add_sample
                          ((TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap> *)&tok.contained,t,pvVar5
                          );
                iVar10 = 0;
              }
              else if (local_2a0[0xc] == '\0') {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar3 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseTimeSampledEnumProperty");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x703);
                ::std::operator<<(poVar3," ");
                ::std::__cxx11::string::string
                          ((string *)local_250,
                           "Attribute `{}`: `{}` at {}\'th timesample is not an allowed token. Ignore it."
                           ,&local_2a9);
                args_1 = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_>
                          *)nonstd::optional_lite::optional<tinyusdz::Token>::value
                                      ((optional<tinyusdz::Token> *)&e);
                pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2a0;
                fmt::format<std::__cxx11::string,unsigned_long,std::__cxx11::string>
                          ((string *)&pv,(fmt *)local_250,local_2a8,pbVar4,(unsigned_long *)args_1,
                           args_2);
                poVar3 = ::std::operator<<((ostream *)&ss_e,(string *)&pv);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                if (warn != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&pv,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_250,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)err);
                  ::std::__cxx11::string::operator=((string *)warn,(string *)&pv);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                iVar10 = 0x16;
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar3 = ::std::operator<<((ostream *)&ss_e,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseTimeSampledEnumProperty");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x701);
                ::std::operator<<(poVar3," ");
                ::std::__cxx11::string::string
                          ((string *)local_250,"Attribute `{}`: `{}` is not an allowed token.",
                           &local_2a9);
                pbVar4 = &nonstd::optional_lite::optional<tinyusdz::Token>::value
                                    ((optional<tinyusdz::Token> *)&e)->str_;
                fmt::format<std::__cxx11::string,std::__cxx11::string>
                          ((string *)&pv,(fmt *)local_250,local_2a8,pbVar4,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           args_1);
                poVar3 = ::std::operator<<((ostream *)&ss_e,(string *)&pv);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                if (err != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&pv,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_250,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)err);
                  ::std::__cxx11::string::operator=((string *)err,(string *)&pv);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                iVar10 = 1;
              }
              nonstd::expected_lite::
              expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~expected(&e_1);
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar3 = ::std::operator<<((ostream *)&ss_e,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseTimeSampledEnumProperty");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x707);
              ::std::operator<<(poVar3," ");
              ::std::__cxx11::string::string
                        ((string *)&pv,
                         "Internal error. Maybe type mismatch? Attribute `{}`\'s {}\'th timesample must be type `token`, but got type `{}`"
                         ,&local_2a9);
              args_1 = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_>
                        *)local_250;
              Attribute::type_name_abi_cxx11_((string *)args_1,attr);
              pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2a0;
              fmt::format<std::__cxx11::string,unsigned_long,std::__cxx11::string>
                        ((string *)&e_1,(fmt *)&pv,local_2a8,pbVar4,(unsigned_long *)args_1,args_2);
              poVar3 = ::std::operator<<((ostream *)&ss_e,(string *)&e_1);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&e_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&pv,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)err);
                ::std::__cxx11::string::operator=((string *)err,(string *)&e_1);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
              iVar10 = 1;
            }
            nonstd::optional_lite::optional<tinyusdz::Token>::~optional
                      ((optional<tinyusdz::Token> *)&e);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar3 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ParseTimeSampledEnumProperty");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x6f9);
          ::std::operator<<(poVar3," ");
          ::std::__cxx11::string::string
                    ((string *)&e_1,"Internal error. Failed to get valueblock info for `{}`",
                     (allocator *)local_250);
          fmt::format<std::__cxx11::string>
                    ((string *)&e,(fmt *)&e_1,(string *)local_2a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar4);
          poVar3 = ::std::operator<<((ostream *)&ss_e,(string *)&e);
          ::std::operator<<(poVar3,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e
                             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &e_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)err);
            ::std::__cxx11::string::operator=((string *)err,(string *)&e);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          iVar10 = 1;
        }
        if ((iVar10 != 0x16) && (iVar10 != 0)) goto LAB_001fa3b0;
      }
    }
    nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>>::operator=
              ((optional<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>> *)&result->_attrib,
               (Animatable<tinyusdz::UsdUVTexture::Wrap> *)&tok);
    bVar2 = true;
LAB_001fa3b2:
    ::std::
    _Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::Sample>_>
    ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::Sample>_>
                     *)&tok.contained);
    return bVar2;
  }
  bVar1 = Attribute::is_blocked(attr);
  if (bVar1) {
    result->_blocked = true;
    return true;
  }
  bVar1 = primvar::PrimVar::is_timesamples(&attr->_var);
  if (bVar1) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar3 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"ParseTimeSampledEnumProperty");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x6ac);
    ::std::operator<<(poVar3," ");
    pcVar9 = "Attribute `{}` is defined as `uniform` variability but TimeSample value is assigned.";
    goto LAB_001f9190;
  }
  Attribute::get_value<tinyusdz::Token>((optional<tinyusdz::Token> *)&ss_e,attr);
  nonstd::optional_lite::optional<tinyusdz::Token>::optional<tinyusdz::Token,_0>
            (&tok,(optional<tinyusdz::Token> *)&ss_e);
  nonstd::optional_lite::optional<tinyusdz::Token>::~optional((optional<tinyusdz::Token> *)&ss_e);
  if (tok.has_value_ != true) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar3 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"ParseTimeSampledEnumProperty");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x6bc);
    ::std::operator<<(poVar3," ");
    ::std::__cxx11::string::string
              ((string *)&e_1,
               "Internal error. Maybe type mismatch? Attribute `{}` must be type `token`, but got type `{}`"
               ,(allocator *)local_250);
    Attribute::type_name_abi_cxx11_((string *)&pv,attr);
    fmt::format<std::__cxx11::string,std::__cxx11::string>
              ((string *)&e,(fmt *)&e_1,prop_name,(string *)&pv,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
    poVar3 = ::std::operator<<((ostream *)&ss_e,(string *)&e);
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err);
      ::std::__cxx11::string::operator=((string *)err,(string *)&e);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    bVar1 = false;
    goto LAB_001fa51b;
  }
  pbVar4 = &nonstd::optional_lite::optional<tinyusdz::Token>::value(&tok)->str_;
  ::std::
  function<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator()(&e,enum_handler,pbVar4);
  if (e.contained.
      super_storage_t_impl<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value == true) {
    pvVar5 = nonstd::expected_lite::
             expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value(&e);
    local_1a0[0].data.__align = (storage_t<double>)0x0;
    local_1a0[0]._8_1_ = 0;
    local_1a0[0]._9_7_ = 0;
    local_1a0[0]._16_1_ = 0;
    local_1a0[0]._17_8_ = 0;
    _ss_e = *pvVar5;
    nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>>::operator=
              ((optional<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>> *)&result->_attrib,
               (Animatable<tinyusdz::UsdUVTexture::Wrap> *)&ss_e);
    ::std::
    _Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::Sample>_>
    ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::Sample>_>
                     *)local_1a0);
LAB_001fa50b:
    bVar1 = true;
  }
  else {
    if (local_2a0[0xc] == '\0') {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar3 = ::std::operator<<((ostream *)&ss_e,"[warn]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ParseTimeSampledEnumProperty");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x6b7);
      ::std::operator<<(poVar3," ");
      ::std::__cxx11::string::string
                ((string *)&pv,"Attribute `{}`: `{}` is not an allowed token. Ignore it.",
                 (allocator *)local_250);
      pbVar4 = &nonstd::optional_lite::optional<tinyusdz::Token>::value(&tok)->str_;
      fmt::format<std::__cxx11::string,std::__cxx11::string>
                ((string *)&e_1,(fmt *)&pv,prop_name,pbVar4,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
      poVar3 = ::std::operator<<((ostream *)&ss_e,(string *)&e_1);
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      if (warn != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pv,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err);
        ::std::__cxx11::string::operator=((string *)warn,(string *)&e_1);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
      result->_empty = true;
      goto LAB_001fa50b;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar3 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"ParseTimeSampledEnumProperty");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x6b5);
    ::std::operator<<(poVar3," ");
    ::std::__cxx11::string::string
              ((string *)&pv,"Attribute `{}`: `{}` is not an allowed token.",(allocator *)local_250)
    ;
    pbVar4 = &nonstd::optional_lite::optional<tinyusdz::Token>::value(&tok)->str_;
    fmt::format<std::__cxx11::string,std::__cxx11::string>
              ((string *)&e_1,(fmt *)&pv,prop_name,pbVar4,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
    poVar3 = ::std::operator<<((ostream *)&ss_e,(string *)&e_1);
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pv,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err);
      ::std::__cxx11::string::operator=((string *)err,(string *)&e_1);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    bVar1 = false;
  }
  nonstd::expected_lite::
  expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~expected(&e);
LAB_001fa51b:
  nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&tok);
  return bVar1;
}

Assistant:

bool ParseTimeSampledEnumProperty(
  const std::string &prop_name,
  bool strict_allowedToken_check,
  EnumHandlerFun<EnumTy> enum_handler,
  const Attribute &attr,
  TypedAttributeWithFallback<Animatable<T>> *result,
  std::string *warn = nullptr,
  std::string *err = nullptr)
{

  if (!result) {
    PUSH_ERROR_AND_RETURN("[Internal error] `result` arg is nullptr.");
  }

  if (attr.is_connection()) {
    PUSH_ERROR_AND_RETURN_F("Attribute connection is not supported in TinyUSDZ for built-in 'enum' token attribute: {}", prop_name);
  }


  if (attr.variability() == Variability::Uniform) {
    // scalar

    if (attr.is_blocked()) {
      result->set_blocked(true);
      return true;
    }

    if (attr.get_var().is_timesamples()) {
      PUSH_ERROR_AND_RETURN_F("Attribute `{}` is defined as `uniform` variability but TimeSample value is assigned.", prop_name);
    }

    if (auto tok = attr.get_value<value::token>()) {
      auto e = enum_handler(tok.value().str());
      if (e) {
        (*result) = e.value();
        return true;
      } else if (strict_allowedToken_check) {
        PUSH_ERROR_AND_RETURN_F("Attribute `{}`: `{}` is not an allowed token.", prop_name, tok.value().str());
      } else {
        PUSH_WARN_F("Attribute `{}`: `{}` is not an allowed token. Ignore it.", prop_name, tok.value().str());
        result->set_value_empty();
        return true;
      }
    } else {
      PUSH_ERROR_AND_RETURN_F("Internal error. Maybe type mismatch? Attribute `{}` must be type `token`, but got type `{}`", prop_name, attr.type_name());
    }


  } else {
    // default and/or TimeSamples
    bool has_default{false};
    bool has_timesamples{false};

    Animatable<T> animatable_value;

    if (attr.is_blocked()) {
      result->set_blocked(true);
      has_default = true;
      //return true;
    }

    if (attr.get_var().has_default()) {
      DCOUT("has default.");

      if (auto tok = attr.get_value<value::token>()) {
        auto e = enum_handler(tok.value().str());
        if (e) {
          animatable_value.set_default(e.value());
          has_default = true;
          //return true;

        } else if (strict_allowedToken_check) {
          PUSH_ERROR_AND_RETURN_F("Attribute `{}`: `{}` is not an allowed token.", prop_name, tok.value().str());
        } else {
          PUSH_WARN_F("Attribute `{}`: `{}` is not an allowed token. Ignore it.", prop_name, tok.value().str());
          //result->set_value_empty();
          //return true;
        }
      } else {
        PUSH_ERROR_AND_RETURN_F("Internal error. Maybe type mismatch? Attribute `{}` must be type `token`, but got type `{}`", prop_name, attr.type_name());
      }
    }

    if (attr.get_var().has_timesamples()) {
      DCOUT("has timesamples.");
      size_t n = attr.get_var().num_timesamples();

      for (size_t i = 0; i < n; i++) {

        double sample_time{value::TimeCode::Default()};

        if (auto pv = attr.get_var().get_ts_time(i)) {
          sample_time = pv.value();
        } else {
          // This should not happen.
          PUSH_ERROR_AND_RETURN_F("Internal error. Failed to get timecode for `{}`", prop_name);
        }

        if (auto pv = attr.get_var().is_ts_value_blocked(i)) {
          if (pv.value() == true) {
            animatable_value.add_blocked_sample(sample_time);
            continue;
          }
        } else {
          // This should not happen.
          PUSH_ERROR_AND_RETURN_F("Internal error. Failed to get valueblock info for `{}`", prop_name);
        }

        if (auto tok = attr.get_var().get_ts_value<value::token>(i)) {
          auto e = enum_handler(tok.value().str());
          if (e) {
            animatable_value.add_sample(sample_time, e.value());
          } else if (strict_allowedToken_check) {
            PUSH_ERROR_AND_RETURN_F("Attribute `{}`: `{}` is not an allowed token.", prop_name, tok.value().str());
          } else {
            PUSH_WARN_F("Attribute `{}`: `{}` at {}'th timesample is not an allowed token. Ignore it.", prop_name, i, tok.value().str());
            continue;
          }
        } else {
          PUSH_ERROR_AND_RETURN_F("Internal error. Maybe type mismatch? Attribute `{}`'s {}'th timesample must be type `token`, but got type `{}`", prop_name, i, attr.type_name());
        }
      }

      has_timesamples = true;
      //return true;

    }

    if (has_default || has_timesamples) {
      result->set_value(animatable_value);
    }

    return true;

  }

  return false;
}